

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small.c
# Opt level: O2

void small_mempool_update_group(small_mempool *small_mempool)

{
  small_mempool_group *psVar1;
  small_mempool *psVar2;
  small_mempool *psVar3;
  uint uVar4;
  mempool *pmVar5;
  small_mempool *psVar6;
  uint uVar7;
  small_mempool *psVar8;
  char *__assertion;
  
  psVar1 = small_mempool->group;
  psVar2 = psVar1->first;
  psVar3 = psVar1->last;
  psVar6 = psVar2;
  do {
    if (psVar3 < psVar6) {
      return;
    }
    uVar7 = psVar6->appropriate_pool_mask & psVar1->active_pool_mask;
    if (uVar7 == 0) {
      __assertion = "used_idx >= 0";
      uVar7 = 0x38;
      goto LAB_001064dd;
    }
    uVar4 = 0;
    if (uVar7 != 0) {
      for (; (uVar7 >> uVar4 & 1) == 0; uVar4 = uVar4 + 1) {
      }
    }
    psVar8 = psVar2 + uVar4;
    psVar6->used_pool = psVar8;
    if (psVar8 < psVar6) {
      __assertion = "pool->used_pool >= pool";
      uVar7 = 0x3a;
      goto LAB_001064dd;
    }
    pmVar5 = &psVar6->pool;
    psVar6 = psVar6 + 1;
  } while (pmVar5->objsize <= (psVar8->pool).objsize);
  __assertion = "pool->pool.objsize <= pool->used_pool->pool.objsize";
  uVar7 = 0x3b;
LAB_001064dd:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/small/small.c",
                uVar7,"void small_mempool_update_group(struct small_mempool *)");
}

Assistant:

static inline void
small_mempool_update_group(struct small_mempool *small_mempool)
{
	for (struct small_mempool *pool = small_mempool->group->first;
	     pool <= small_mempool->group->last; pool++) {
		/*
		 * Recalculate pools for allocation.
		 * We select the pool with the lowest index,
		 * thus reducing allocation waste.
		 */
		int used_idx =
			__builtin_ffs(small_mempool->group->active_pool_mask &
				      pool->appropriate_pool_mask) - 1;
		assert(used_idx >= 0);
		pool->used_pool = small_mempool->group->first + used_idx;
		assert(pool->used_pool >= pool);
		assert(pool->pool.objsize <= pool->used_pool->pool.objsize);
	}
}